

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O0

VRDisplayNode *
MinVR::VRProjectionNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  VRDisplayNode *pVVar1;
  string *in_RDX;
  char *in_RSI;
  float fVar2;
  float fVar3;
  VRProjectionNode *node;
  float fovX;
  float fovY;
  float farClip;
  float nearClip;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_168 [7];
  undefined1 in_stack_fffffffffffffe9f;
  string *in_stack_fffffffffffffea0;
  float *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffebc;
  string local_140 [36];
  float local_11c;
  string local_118 [32];
  undefined4 local_f8;
  allocator<char> local_f1;
  string local_f0 [36];
  float local_cc;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  VRProjectionNode *in_stack_ffffffffffffff50;
  undefined1 local_a1 [37];
  float local_7c;
  string local_78 [32];
  undefined4 local_58;
  allocator<char> local_41;
  string local_40 [36];
  float local_1c;
  string *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  local_58 = 0x3a83126f;
  std::__cxx11::string::string(local_78,local_18);
  fVar2 = VRDataIndex::getValueWithDefault<float>
                    ((VRDataIndex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (bool)in_stack_fffffffffffffe9f);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
  local_1c = fVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,local_10,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::__cxx11::string::string((string *)&stack0xffffffffffffff38,local_18);
  fVar2 = VRDataIndex::getValueWithDefault<float>
                    ((VRDataIndex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (bool)in_stack_fffffffffffffe9f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  local_7c = fVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,local_10,(allocator<char> *)CONCAT44(fVar2,in_stack_fffffffffffffe60));
  local_f8 = 0x42700000;
  std::__cxx11::string::string(local_118,local_18);
  fVar3 = VRDataIndex::getValueWithDefault<float>
                    ((VRDataIndex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (bool)in_stack_fffffffffffffe9f);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_cc = fVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,local_10,(allocator<char> *)CONCAT44(fVar2,in_stack_fffffffffffffe60));
  uVar4 = 0x42700000;
  std::__cxx11::string::string(local_168,local_18);
  fVar2 = VRDataIndex::getValueWithDefault<float>
                    ((VRDataIndex *)CONCAT44(in_stack_fffffffffffffebc,uVar4),
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (bool)in_stack_fffffffffffffe9f);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
  local_11c = fVar2;
  pVVar1 = (VRDisplayNode *)operator_new(0xd0);
  VRProjectionNode(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                   in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  return pVVar1;
}

Assistant:

VRDisplayNode* VRProjectionNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace){
  float nearClip = config->getValueWithDefault("NearClip", 0.001f, nameSpace);
  float farClip = config->getValueWithDefault("FarClip", 500.0f, nameSpace);
  float fovY = config->getValueWithDefault("FieldOfViewY", 60.0f, nameSpace);
  float fovX = config->getValueWithDefault("FieldOfViewX", 60.0f, nameSpace);

  VRProjectionNode *node = new VRProjectionNode(nameSpace, fovX, fovY, nearClip, farClip);

  return node;
}